

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O1

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::triangle
          (ImGuiDrawListGraphicsAdaptor *this,float x1,float y1,float x2,float y2,float x3,float y3,
          bool fill,color *c)

{
  ImDrawList *this_00;
  ImU32 IVar1;
  undefined7 in_register_00000031;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec4 local_38;
  
  this_00 = this->draw_list;
  local_50.x = x3;
  local_50.y = y3;
  local_48.x = x2;
  local_48.y = y2;
  local_40.x = x1;
  local_40.y = y1;
  if ((int)CONCAT71(in_register_00000031,fill) == 0) {
    local_38.y = *c->g;
    local_38.x = *c->r;
    local_38.w = *c->a;
    local_38.z = *c->b;
    IVar1 = ImGui::ColorConvertFloat4ToU32(&local_38);
    ImDrawList::AddTriangle(this_00,&local_40,&local_48,&local_50,IVar1,1.0);
  }
  else {
    local_38.y = *c->g;
    local_38.x = *c->r;
    local_38.w = *c->a;
    local_38.z = *c->b;
    IVar1 = ImGui::ColorConvertFloat4ToU32(&local_38);
    ImDrawList::AddTriangleFilled(this_00,&local_40,&local_48,&local_50,IVar1);
  }
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::triangle(float x1, float y1, float x2,
                                            float y2, float x3, float y3,
                                            bool fill, const color::color& c) {
    if (fill) {
        draw_list->AddTriangleFilled(ImVec2(x1, y1), ImVec2(x2, y2),
                                     ImVec2(x3, y3),
                                     ImColor(c.r, c.g, c.b, c.a));
    } else {
        draw_list->AddTriangle(ImVec2(x1, y1), ImVec2(x2, y2), ImVec2(x3, y3),
                               ImColor(c.r, c.g, c.b, c.a));
    }
}